

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autobondrot.c
# Opt level: O3

void autobondrot(FILE *outf,xformDatabase *xdb,abrProbeProc *probeProc,void *probestuff,
                abrAtomListProc *delAtomProc,void *deletestuff,int dumpGoToAtoms)

{
  transformData *ptVar1;
  atom *paVar2;
  goToRec_t *pgVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  bool bVar7;
  double dVar8;
  double dVar9;
  
  if (xdb != (xformDatabase *)0x0) {
    pgVar3 = xdb->golist;
    if (pgVar3 == (goToRec *)0x0) {
      if (0 < xdb->nlevs) {
        lVar6 = 0;
        do {
          ptVar1 = xdb->level[lVar6];
          ptVar1->currVal = ptVar1->startVal;
          rebuildTmat(ptVar1);
          lVar6 = lVar6 + 1;
          iVar5 = xdb->nlevs;
        } while (lVar6 < iVar5);
        if (0 < iVar5) {
          uVar4 = (ulong)(iVar5 - 1);
          bVar7 = false;
          while( true ) {
            iVar5 = (int)uVar4;
            if (!bVar7) {
              do {
                paVar2 = orientedAtoms(xdb);
                dVar8 = runnameAndTorsion(xdb,XFworkBuf,300);
                (*probeProc)(XFworkBuf,dVar8,paVar2,probestuff);
                cleanupListExtras(paVar2,xdb,delAtomProc,deletestuff);
                ptVar1 = xdb->level[(long)xdb->nlevs + -1];
                uVar4 = (long)xdb->nlevs - 1;
                ptVar1->currVal = ptVar1->stepVal + ptVar1->currVal;
                rebuildTmat(ptVar1);
                dVar8 = ptVar1->currVal;
                if (ptVar1->stepVal <= 0.0) {
                  dVar9 = ptVar1->endVal + -1e-05;
                  bVar7 = dVar9 < dVar8;
                }
                else {
                  dVar9 = ptVar1->endVal + 1e-05;
                  bVar7 = dVar8 < dVar9;
                }
                iVar5 = (int)uVar4;
              } while (bVar7 || dVar8 == dVar9);
            }
            ptVar1 = xdb->level[uVar4];
            ptVar1->currVal = ptVar1->startVal;
            rebuildTmat(ptVar1);
            if (iVar5 < 1) break;
            uVar4 = (ulong)(iVar5 - 1);
            ptVar1 = xdb->level[uVar4];
            ptVar1->currVal = ptVar1->stepVal + ptVar1->currVal;
            rebuildTmat(ptVar1);
            bVar7 = ptVar1->currVal < ptVar1->endVal + -1e-05;
            if (0.0 < ptVar1->stepVal) {
              bVar7 = ptVar1->endVal + 1e-05 < ptVar1->currVal;
            }
          }
        }
      }
    }
    else {
      do {
        if (0 < xdb->nlevs) {
          lVar6 = 0;
          do {
            ptVar1 = xdb->level[lVar6];
            ptVar1->currVal = pgVar3->level[lVar6];
            rebuildTmat(ptVar1);
            lVar6 = lVar6 + 1;
          } while (lVar6 < xdb->nlevs);
        }
        paVar2 = orientedAtoms(xdb);
        dVar8 = runnameAndTorsion(xdb,XFworkBuf,300);
        if (dumpGoToAtoms != 0) {
          fprintf((FILE *)outf,"REMARK Atoms Rotated To %s\n",XFworkBuf);
          XFdescribeAtomList(outf,paVar2);
        }
        (*probeProc)(XFworkBuf,dVar8,paVar2,probestuff);
        cleanupListExtras(paVar2,xdb,delAtomProc,deletestuff);
        pgVar3 = pgVar3->next;
      } while (pgVar3 != (goToRec_t *)0x0);
    }
  }
  return;
}

Assistant:

void autobondrot(FILE *outf, xformDatabase* xdb,
	       abrProbeProc    probeProc,   void *probestuff,
	       abrAtomListProc delAtomProc, void *deletestuff,
	       int dumpGoToAtoms) 
{/*autobondrot()*/
/*where:  (see probe/autobondrot(...); )
   outf  == stderr
   xdb   == xdb
   probeProc == movingDoCommand
   probestuff == mcis
   delAtomProc == deleteMovingAtom
   deletestuff == mabis
   dumpGoToAtoms == Verbose
*/

   int overflow = FALSE, cursor = 0;
   transformData* xform = NULL;
   goToRec* g = NULL;
   atom* alst = NULL;
   double torsionScore = 0.0;

   if (xdb)
   {
      if (xdb->golist)  /*working from a list of GO statements */
      {/*if using GO statements: specific orientations requested */
         for(g = xdb->golist; g; g = g->next) 
         {
            setOrientation(xdb, g);

            alst = orientedAtoms(xdb); /* atom* alst == atom *allMovingAtoms */
	    torsionScore = runnameAndTorsion(xdb, XFworkBuf, MAX_XF_REC_LEN);

            /*torsionScore is NOT a score, holds angle-bias to modify score*/

	    if (dumpGoToAtoms) 
            {
	       fprintf(outf, "REMARK Atoms Rotated To %s\n", XFworkBuf);
	       XFdescribeAtomList(outf, alst);
	    }

            probeProc(XFworkBuf, torsionScore, alst, probestuff); 
               /* process the oriented atoms */
               /*probeProc == movingDoCommand() which calls doCommand()*/
               /*where: (see probe.c/movingDoCommand() )
                    XFworkBuf == char* orientationName  holds angle values
                    torsionScore == double scoreBias
                    alst == atom *allMovingAtoms existance implies autobondrot
                    probestuff == void *userdata == mcis
               */

            cleanupListExtras(alst, xdb, delAtomProc, deletestuff);
         }
         return; /* can quit when we are done with the 'go to's */
      }/*if using GO statements: specific orientations requested */

      /*else: working from intermixed atoms and transformations */

      /* initialize transformation values */
      for(cursor=0; cursor < xdb->nlevs; cursor++) {
         xform = xdb->level[cursor];
         xform->currVal = xform->startVal;
         rebuildTmat(xform);
      }

#define ABR_COMP_EPSILON 0.00001

      overflow = FALSE;
      cursor = xdb->nlevs - 1;
      while(cursor >= 0) 
      {
         while(! overflow) 
         {

            alst = orientedAtoms(xdb); /* atom* alst == atom *allMovingAtoms */
	    torsionScore = runnameAndTorsion(xdb, XFworkBuf, MAX_XF_REC_LEN);

            /*torsionScore is NOT a score, holds angle-bias to modify score*/

            probeProc(XFworkBuf, torsionScore, alst, probestuff); 
               /* process the oriented atoms */
               /*probeProc == movingDoCommand() which calls doCommand()*/
               /*where: (see probe.c/movingDoCommand() )
                    XFworkBuf == char* orientationName  holds angle values
                    torsionScore == double scoreBias
                    alst == atom *allMovingAtoms existance implies autobondrot
                    probestuff == void *userdata == mcis
               */
 
            cleanupListExtras(alst, xdb, delAtomProc, deletestuff);

            cursor = xdb->nlevs - 1;
            xform = xdb->level[cursor];
            xform->currVal += xform->stepVal;
            rebuildTmat(xform);
            overflow = (xform->stepVal > 0)
                       ?  (xform->currVal > (xform->endVal + ABR_COMP_EPSILON))
                       :  (xform->currVal < (xform->endVal - ABR_COMP_EPSILON));
         }

         xform = xdb->level[cursor];
         xform->currVal = xform->startVal;
         rebuildTmat(xform);

         overflow = FALSE;

         if (--cursor >= 0) 
         {
            xform = xdb->level[cursor];
            xform->currVal += xform->stepVal;
            rebuildTmat(xform);
            overflow = (xform->stepVal > 0)
                      ?  (xform->currVal > (xform->endVal + ABR_COMP_EPSILON))
                      :  (xform->currVal < (xform->endVal - ABR_COMP_EPSILON));
         }
      }
   }
}